

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O1

void __thiscall FormatTest_UDL_Test::TestBody(FormatTest_UDL_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper AStack_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  fmt::v5::internal::udl_formatter<char,(char)123,(char)125>::operator()
            (&local_30,(udl_formatter<char,(char)123,(char)125> *)&AStack_48,(char (*) [5])0x18d794)
  ;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_40,"\"{}\"_format(\"test\")","\"test\"",&local_30,(char (*) [5])0x18d794);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/ostream-test.cc"
               ,0xc6,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
      }
      local_30._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, UDL) {
  using namespace fmt::literals;
  EXPECT_EQ("{}"_format("test"), "test");
}